

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O2

ostream * operator<<(ostream *os,HistogramBasedDistribution *distribution)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  pointer ppVar4;
  double dVar5;
  
  ppVar4 = (distribution->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar3 = -1;
  dVar5 = -1.0;
  do {
    if (ppVar4 != (distribution->values).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      iVar1 = ppVar4->first;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar3);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,ppVar4->first + -1);
      std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<double>(dVar5 * (double)(iVar1 - iVar3));
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    iVar3 = ppVar4->first;
    dVar5 = ppVar4->second;
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (distribution->values).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = distribution->max;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar3);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,distribution->max);
  std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<double>(dVar5 * (double)((iVar1 - iVar3) + 1));
  std::endl<char,std::char_traits<char>>(poVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HistogramBasedDistribution& distribution) {
	vector<HistogramBasedDistribution::value_t>::const_iterator cit = distribution.values.begin();
	int start = -1;
	double p = -1.0;
	while (true) {
		if (cit != distribution.values.begin()) {
			int length = cit->first - start;
			os << start << ' ' << (cit->first-1) << ' ' << (p*length) << endl;
		}
		start = cit->first;
		p = cit->second;
		++cit;
		if (cit == distribution.values.end()) {
			int length = distribution.max - start + 1;
			os << start << ' ' << distribution.max << ' ' << (p*length) << endl;
			break;
		}
	}
	return os;
}